

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_get_universalbinary_count
              (Dwarf_Debug dbg,Dwarf_Unsigned *current_index,Dwarf_Unsigned *available_count)

{
  Dwarf_Unsigned *available_count_local;
  Dwarf_Unsigned *current_index_local;
  Dwarf_Debug dbg_local;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    dbg_local._4_4_ = -1;
  }
  else if (dbg->de_universalbinary_count == 0) {
    dbg_local._4_4_ = -1;
  }
  else {
    if (current_index != (Dwarf_Unsigned *)0x0) {
      *current_index = (ulong)dbg->de_universalbinary_index;
    }
    if (available_count != (Dwarf_Unsigned *)0x0) {
      *available_count = (ulong)dbg->de_universalbinary_count;
    }
    dbg_local._4_4_ = 0;
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_universalbinary_count(
    Dwarf_Debug dbg,
    Dwarf_Unsigned *current_index,
    Dwarf_Unsigned *available_count)
{
    if (IS_INVALID_DBG(dbg)) {
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_universalbinary_count ) {
        return DW_DLV_NO_ENTRY;
    }
    if (current_index) {
        *current_index = dbg->de_universalbinary_index;
    }
    if (available_count) {
        *available_count = dbg->de_universalbinary_count;
    }
    return DW_DLV_OK;
}